

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O1

Abc_ManCut_t *
Abc_NtkManCutStart(int nNodeSizeMax,int nConeSizeMax,int nNodeFanStop,int nConeFanStop)

{
  Abc_ManCut_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Vec_t *pVVar4;
  
  pAVar1 = (Abc_ManCut_t *)malloc(0x38);
  pAVar1->nNodeSizeMax = 0;
  pAVar1->nConeSizeMax = 0;
  pAVar1->nNodeFanStop = 0;
  pAVar1->nConeFanStop = 0;
  pAVar1->vNodeLeaves = (Vec_Ptr_t *)0x0;
  pAVar1->vConeLeaves = (Vec_Ptr_t *)0x0;
  pAVar1->vVisited = (Vec_Ptr_t *)0x0;
  pAVar1->vLevels = (Vec_Vec_t *)0x0;
  pAVar1->vNodesTfo = (Vec_Ptr_t *)0x0;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pAVar1->vNodeLeaves = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pAVar1->vConeLeaves = pVVar2;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pAVar1->vVisited = pVVar2;
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar4->pArray = ppvVar3;
  pAVar1->vLevels = pVVar4;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pAVar1->vNodesTfo = pVVar2;
  pAVar1->nNodeSizeMax = nNodeSizeMax;
  pAVar1->nConeSizeMax = nConeSizeMax;
  pAVar1->nNodeFanStop = nNodeFanStop;
  pAVar1->nConeFanStop = nConeFanStop;
  return pAVar1;
}

Assistant:

Abc_ManCut_t * Abc_NtkManCutStart( int nNodeSizeMax, int nConeSizeMax, int nNodeFanStop, int nConeFanStop )
{
    Abc_ManCut_t * p;
    p = ABC_ALLOC( Abc_ManCut_t, 1 );
    memset( p, 0, sizeof(Abc_ManCut_t) );
    p->vNodeLeaves  = Vec_PtrAlloc( 100 );
    p->vConeLeaves  = Vec_PtrAlloc( 100 );
    p->vVisited     = Vec_PtrAlloc( 100 );
    p->vLevels      = Vec_VecAlloc( 100 );
    p->vNodesTfo    = Vec_PtrAlloc( 100 );
    p->nNodeSizeMax = nNodeSizeMax;
    p->nConeSizeMax = nConeSizeMax;
    p->nNodeFanStop = nNodeFanStop;
    p->nConeFanStop = nConeFanStop;
    return p;
}